

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

char * xm_load_module(xm_context_t *ctx,char *moddata,size_t moddata_length,char *mempool)

{
  xm_instrument_t *pxVar1;
  xm_sample_t *pxVar2;
  size_t __n;
  byte bVar3;
  uint16_t k;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint8_t *puVar8;
  byte bVar9;
  ushort uVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  uint8_t uVar15;
  byte bVar16;
  xm_instrument_t *pxVar17;
  byte bVar18;
  ushort uVar19;
  ushort uVar20;
  xm_pattern_t *pxVar21;
  short sVar22;
  uint uVar23;
  ulong uVar24;
  byte bVar25;
  char cVar26;
  char cVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  uint8_t *src_c;
  long lVar32;
  float fVar33;
  xm_instrument_t *local_70;
  uint16_t *local_68;
  long local_60;
  long local_48;
  
  if (moddata_length < 0x3d) {
    bVar9 = 0;
    uVar5 = 0;
LAB_00103418:
    uVar13 = 0;
  }
  else {
    uVar5 = (ulong)(byte)moddata[0x3c];
    if (moddata_length == 0x3d) {
LAB_00103416:
      bVar9 = 0;
      goto LAB_00103418;
    }
    uVar5 = (ulong)CONCAT11(moddata[0x3d],moddata[0x3c]);
    if (moddata_length < 0x3f) goto LAB_00103416;
    bVar9 = moddata[0x3e];
    if (moddata_length == 0x3f) goto LAB_00103418;
    uVar13 = (uint)(byte)moddata[0x3f] << 8;
  }
  if (moddata_length < 0x41) {
    uVar10 = 0;
LAB_001034cf:
    (ctx->module).length = uVar10;
LAB_001034d4:
    uVar10 = 0;
LAB_001034d6:
    (ctx->module).restart_position = uVar10;
LAB_001034db:
    uVar10 = 0;
LAB_001034dd:
    (ctx->module).num_channels = uVar10;
LAB_001034e6:
    uVar10 = 0;
LAB_001034e8:
    (ctx->module).num_patterns = uVar10;
LAB_001034f6:
    bVar14 = 0;
LAB_001034f8:
    uVar19 = 0;
  }
  else {
    uVar10 = (ushort)(byte)moddata[0x40];
    if (moddata_length == 0x41) goto LAB_001034cf;
    (ctx->module).length = CONCAT11(moddata[0x41],moddata[0x40]);
    if (moddata_length < 0x43) goto LAB_001034d4;
    uVar10 = (ushort)(byte)moddata[0x42];
    if (moddata_length == 0x43) goto LAB_001034d6;
    (ctx->module).restart_position = CONCAT11(moddata[0x43],moddata[0x42]);
    if (moddata_length < 0x45) goto LAB_001034db;
    uVar10 = (ushort)(byte)moddata[0x44];
    if (moddata_length == 0x45) goto LAB_001034dd;
    (ctx->module).num_channels = CONCAT11(moddata[0x45],moddata[0x44]);
    if (moddata_length < 0x47) goto LAB_001034e6;
    uVar10 = (ushort)(byte)moddata[0x46];
    if (moddata_length == 0x47) goto LAB_001034e8;
    uVar10 = CONCAT11(moddata[0x47],moddata[0x46]);
    (ctx->module).num_patterns = uVar10;
    if (moddata_length < 0x49) goto LAB_001034f6;
    bVar14 = moddata[0x48];
    if (moddata_length == 0x49) goto LAB_001034f8;
    uVar19 = (ushort)(byte)moddata[0x49] << 8;
  }
  local_68 = &(ctx->module).num_patterns;
  (ctx->module).num_instruments = uVar19 | bVar14;
  (ctx->module).patterns = (xm_pattern_t *)mempool;
  (ctx->module).instruments = (xm_instrument_t *)(mempool + (ulong)uVar10 * 0x10);
  if (moddata_length < 0x4b) {
    (ctx->module).frequency_type = XM_AMIGA_FREQUENCIES;
LAB_0010358b:
    uVar11 = 0;
LAB_0010358d:
    ctx->tempo = uVar11;
LAB_00103595:
    uVar11 = 0;
  }
  else {
    (ctx->module).frequency_type = ~(uint)(byte)moddata[0x4a] & XM_AMIGA_FREQUENCIES;
    if (moddata_length < 0x4d) goto LAB_0010358b;
    uVar11 = (ushort)(byte)moddata[0x4c];
    if (moddata_length == 0x4d) goto LAB_0010358d;
    cVar26 = moddata[0x4d];
    ctx->tempo = CONCAT11(cVar26,moddata[0x4c]);
    if (moddata_length == 0x4e) goto LAB_00103595;
    uVar11 = CONCAT11(cVar26,moddata[0x4e]);
    if (0x4f < moddata_length) {
      uVar4 = (ushort)(byte)moddata[0x4f] << 8;
      goto LAB_00103599;
    }
  }
  uVar4 = 0;
LAB_00103599:
  local_70 = (xm_instrument_t *)(mempool + (ulong)uVar10 * 0x10) + ((uint)uVar19 | (uint)bVar14);
  ctx->bpm = uVar4 | uVar11 & 0xff;
  uVar30 = 0;
  uVar31 = moddata_length - 0x50;
  if (moddata_length < 0x50) {
    uVar31 = uVar30;
  }
  if (0xff < uVar31) {
    uVar31 = 0x100;
  }
  memcpy((ctx->module).pattern_table,moddata + 0x50,uVar31);
  memset((ctx->module).pattern_table + uVar31,0,0x100 - uVar31);
  uVar5 = ((uVar13 | bVar9) << 0x10 | uVar5) + 0x3c;
  for (; uVar30 < *local_68; uVar30 = uVar30 + 1) {
    if (uVar5 + 7 < moddata_length) {
      uVar10 = (ushort)(byte)moddata[uVar5 + 7];
    }
    else {
      uVar10 = 0;
    }
    if (uVar5 + 8 < moddata_length) {
      uVar19 = (ushort)(byte)moddata[uVar5 + 8] << 8;
    }
    else {
      uVar19 = 0;
    }
    if (uVar5 + 5 < moddata_length) {
      uVar11 = (ushort)(byte)moddata[uVar5 + 5];
    }
    else {
      uVar11 = 0;
    }
    if (uVar5 + 6 < moddata_length) {
      uVar4 = (ushort)(byte)moddata[uVar5 + 6] << 8;
    }
    else {
      uVar4 = 0;
    }
    pxVar21 = (ctx->module).patterns + uVar30;
    pxVar21->num_rows = uVar11 | uVar4;
    pxVar21->slots = (xm_pattern_slot_t *)local_70;
    if (uVar5 < moddata_length) {
      uVar31 = (ulong)(byte)moddata[uVar5];
    }
    else {
      uVar31 = 0;
    }
    if (uVar5 + 1 < moddata_length) {
      uVar24 = (ulong)(byte)moddata[uVar5 + 1] << 8;
    }
    else {
      uVar24 = 0;
    }
    if (uVar5 + 2 < moddata_length) {
      uVar13 = (uint)(byte)moddata[uVar5 + 2];
    }
    else {
      uVar13 = 0;
    }
    if (uVar5 + 3 < moddata_length) {
      uVar7 = (uint)(byte)moddata[uVar5 + 3] << 8;
    }
    else {
      uVar7 = 0;
    }
    __n = (ulong)(uVar11 | uVar4) * (ulong)(ctx->module).num_channels * 5;
    lVar32 = ((ulong)((uVar7 | uVar13) << 0x10) | uVar24 | uVar31) + uVar5;
    if ((uVar10 | uVar19) == 0) {
      memset(local_70,0,__n);
    }
    else {
      uVar4 = 0;
      uVar11 = 0;
      while (uVar11 < (uVar10 | uVar19)) {
        uVar5 = (ulong)uVar11 + lVar32;
        if (uVar5 < moddata_length) {
          bVar9 = moddata[uVar5];
        }
        else {
          bVar9 = 0;
        }
        puVar8 = local_70->sample_of_notes + (ulong)uVar4 * 5 + -2;
        if ((char)bVar9 < '\0') {
          uVar20 = uVar11 + 1;
          if ((bVar9 & 1) == 0) {
            *puVar8 = 0;
          }
          else {
            if ((ulong)uVar20 + lVar32 < moddata_length) {
              bVar14 = moddata[(ulong)uVar20 + lVar32];
            }
            else {
              bVar14 = 0;
            }
            *puVar8 = bVar14;
            uVar20 = uVar11 + 2;
          }
          if ((bVar9 & 2) == 0) {
            puVar8[1] = 0;
          }
          else {
            if ((ulong)uVar20 + lVar32 < moddata_length) {
              bVar14 = moddata[(ulong)uVar20 + lVar32];
            }
            else {
              bVar14 = 0;
            }
            puVar8[1] = bVar14;
            uVar20 = uVar20 + 1;
          }
          if ((bVar9 & 4) == 0) {
            puVar8[2] = 0;
          }
          else {
            if ((ulong)uVar20 + lVar32 < moddata_length) {
              bVar14 = moddata[(ulong)uVar20 + lVar32];
            }
            else {
              bVar14 = 0;
            }
            puVar8[2] = bVar14;
            uVar20 = uVar20 + 1;
          }
          if ((bVar9 & 8) == 0) {
            puVar8[3] = 0;
          }
          else {
            if ((ulong)uVar20 + lVar32 < moddata_length) {
              bVar14 = moddata[(ulong)uVar20 + lVar32];
            }
            else {
              bVar14 = 0;
            }
            puVar8[3] = bVar14;
            uVar20 = uVar20 + 1;
          }
          if ((bVar9 & 0x10) == 0) {
            puVar8[4] = 0;
            uVar11 = uVar20;
          }
          else {
            if ((ulong)uVar20 + lVar32 < moddata_length) {
              bVar9 = moddata[(ulong)uVar20 + lVar32];
            }
            else {
              bVar9 = 0;
            }
            puVar8[4] = bVar9;
            uVar11 = uVar20 + 1;
          }
        }
        else {
          *puVar8 = bVar9;
          if (uVar5 + 1 < moddata_length) {
            bVar9 = moddata[uVar5 + 1];
          }
          else {
            bVar9 = 0;
          }
          puVar8[1] = bVar9;
          if (uVar5 + 2 < moddata_length) {
            bVar9 = moddata[uVar5 + 2];
          }
          else {
            bVar9 = 0;
          }
          puVar8[2] = bVar9;
          if (uVar5 + 3 < moddata_length) {
            bVar9 = moddata[uVar5 + 3];
          }
          else {
            bVar9 = 0;
          }
          puVar8[3] = bVar9;
          if (uVar5 + 4 < moddata_length) {
            bVar9 = moddata[uVar5 + 4];
          }
          else {
            bVar9 = 0;
          }
          puVar8[4] = bVar9;
          uVar11 = uVar11 + 5;
        }
        uVar4 = uVar4 + 1;
      }
    }
    local_70 = (xm_instrument_t *)(local_70->sample_of_notes + (__n - 2));
    uVar5 = lVar32 + (ulong)(uVar10 | uVar19);
  }
  local_60 = 100;
  local_48 = 0x9c;
  uVar31 = 0;
  do {
    if ((ctx->module).num_instruments <= uVar31) {
      return (char *)local_70;
    }
    uVar13 = 0;
    uVar7 = 0;
    if (uVar5 < moddata_length) {
      uVar7 = (uint)(byte)moddata[uVar5];
    }
    if (uVar5 + 1 < moddata_length) {
      uVar13 = (uint)(byte)moddata[uVar5 + 1] << 8;
    }
    uVar28 = 0;
    uVar12 = 0;
    if (uVar5 + 2 < moddata_length) {
      uVar12 = (uint)(byte)moddata[uVar5 + 2];
    }
    if (uVar5 + 3 < moddata_length) {
      uVar28 = (uint)(byte)moddata[uVar5 + 3] << 8;
    }
    uVar12 = (uVar28 | uVar12) * 0x10000;
    uVar28 = uVar13 | uVar7 | uVar12;
    if (((uVar13 | uVar7) + uVar12) - 0x108 < 0xfffffef9) {
      uVar28 = 0x107;
    }
    uVar30 = uVar28 + uVar5;
    if (uVar5 + 0x1b < uVar30) {
      uVar10 = (ushort)(byte)moddata[uVar5 + 0x1b];
    }
    else {
      uVar10 = 0;
    }
    if (uVar5 + 0x1c < uVar30) {
      uVar19 = (ushort)(byte)moddata[uVar5 + 0x1c] << 8;
    }
    else {
      uVar19 = 0;
    }
    pxVar1 = (ctx->module).instruments;
    pxVar17 = pxVar1 + uVar31;
    pxVar17->num_samples = uVar19 | uVar10;
    if ((uVar19 | uVar10) == 0) {
      pxVar17->samples = (xm_sample_t *)0x0;
      uVar24 = 0;
    }
    else {
      uVar24 = 0;
      if (uVar5 + 0x21 <= uVar30) {
        uVar24 = uVar30 - (uVar5 + 0x21);
      }
      if (0x5f < uVar24) {
        uVar24 = 0x60;
      }
      memcpy(pxVar17->sample_of_notes,moddata + uVar5 + 0x21,uVar24);
      memset(pxVar17->sample_of_notes + uVar24,0,0x60 - uVar24);
      bVar9 = 0;
      if ((uVar5 + 0xe1 < uVar30) && (bVar9 = moddata[uVar5 + 0xe1], 0xb < bVar9)) {
        bVar9 = 0xc;
      }
      (pxVar17->volume_envelope).num_points = bVar9;
      if (uVar5 + 0xe2 < uVar30) {
        bVar14 = moddata[uVar5 + 0xe2];
        if (0xb < bVar14) {
          bVar14 = 0xc;
        }
      }
      else {
        bVar14 = 0;
      }
      (pxVar17->panning_envelope).num_points = bVar14;
      for (uVar24 = 0; (uint)bVar9 * 4 != uVar24; uVar24 = uVar24 + 4) {
        if (uVar24 + uVar5 + 0x81 < uVar30) {
          uVar10 = (ushort)(byte)moddata[uVar24 + uVar5 + 0x81];
        }
        else {
          uVar10 = 0;
        }
        if (uVar24 + uVar5 + 0x82 < uVar30) {
          uVar19 = (ushort)(byte)moddata[uVar24 + uVar5 + 0x82] << 8;
        }
        else {
          uVar19 = 0;
        }
        *(ushort *)(pxVar1->sample_of_notes + uVar24 + local_60 + -4) = uVar10 | uVar19;
        if (uVar24 + uVar5 + 0x83 < uVar30) {
          uVar10 = (ushort)(byte)moddata[uVar24 + uVar5 + 0x83];
        }
        else {
          uVar10 = 0;
        }
        if (uVar24 + uVar5 + 0x84 < uVar30) {
          uVar19 = (ushort)(byte)moddata[uVar24 + uVar5 + 0x84] << 8;
        }
        else {
          uVar19 = 0;
        }
        *(ushort *)(pxVar1->sample_of_notes + uVar24 + local_60 + -2) = uVar10 | uVar19;
      }
      for (uVar24 = 0; (uint)bVar14 * 4 != uVar24; uVar24 = uVar24 + 4) {
        if (uVar24 + uVar5 + 0xb1 < uVar30) {
          uVar10 = (ushort)(byte)moddata[uVar24 + uVar5 + 0xb1];
        }
        else {
          uVar10 = 0;
        }
        if (uVar24 + uVar5 + 0xb2 < uVar30) {
          uVar19 = (ushort)(byte)moddata[uVar24 + uVar5 + 0xb2] << 8;
        }
        else {
          uVar19 = 0;
        }
        *(ushort *)(pxVar1->sample_of_notes + uVar24 + local_48 + -4) = uVar10 | uVar19;
        if (uVar24 + uVar5 + 0xb3 < uVar30) {
          uVar10 = (ushort)(byte)moddata[uVar24 + uVar5 + 0xb3];
        }
        else {
          uVar10 = 0;
        }
        if (uVar24 + uVar5 + 0xb4 < uVar30) {
          uVar19 = (ushort)(byte)moddata[uVar24 + uVar5 + 0xb4] << 8;
        }
        else {
          uVar19 = 0;
        }
        *(ushort *)(pxVar1->sample_of_notes + uVar24 + local_48 + -2) = uVar10 | uVar19;
      }
      if (uVar5 + 0xe3 < uVar30) {
        uVar15 = moddata[uVar5 + 0xe3];
      }
      else {
        uVar15 = '\0';
      }
      (pxVar17->volume_envelope).sustain_point = uVar15;
      if (uVar5 + 0xe4 < uVar30) {
        bVar16 = moddata[uVar5 + 0xe4];
      }
      else {
        bVar16 = 0;
      }
      (pxVar17->volume_envelope).loop_start_point = bVar16;
      if (uVar5 + 0xe5 < uVar30) {
        bVar18 = moddata[uVar5 + 0xe5];
      }
      else {
        bVar18 = 0;
      }
      (pxVar17->volume_envelope).loop_end_point = bVar18;
      if (uVar5 + 0xe6 < uVar30) {
        uVar15 = moddata[uVar5 + 0xe6];
      }
      else {
        uVar15 = '\0';
      }
      (pxVar17->panning_envelope).sustain_point = uVar15;
      if (uVar5 + 0xe7 < uVar30) {
        bVar3 = moddata[uVar5 + 0xe7];
      }
      else {
        bVar3 = 0;
      }
      (pxVar17->panning_envelope).loop_start_point = bVar3;
      if (uVar5 + 0xe8 < uVar30) {
        bVar25 = moddata[uVar5 + 0xe8];
      }
      else {
        bVar25 = 0;
      }
      (pxVar17->panning_envelope).loop_end_point = bVar25;
      if (bVar9 != 0) {
        uVar7 = bVar9 - 1;
        uVar13 = (uint)bVar16;
        if (uVar7 <= bVar16) {
          uVar13 = uVar7;
        }
        (pxVar17->volume_envelope).loop_start_point = (uint8_t)uVar13;
        bVar9 = (byte)uVar7;
        if (bVar18 < uVar7) {
          bVar9 = bVar18;
        }
        (pxVar17->volume_envelope).loop_end_point = bVar9;
      }
      if (bVar14 != 0) {
        uVar13 = bVar14 - 1;
        if (uVar13 <= bVar3) {
          bVar3 = (byte)uVar13;
        }
        (pxVar17->panning_envelope).loop_start_point = bVar3;
        bVar9 = (byte)uVar13;
        if (bVar25 < uVar13) {
          bVar9 = bVar25;
        }
        (pxVar17->panning_envelope).loop_end_point = bVar9;
      }
      if (uVar5 + 0xe9 < uVar30) {
        bVar9 = moddata[uVar5 + 0xe9];
      }
      else {
        bVar9 = 0;
      }
      (pxVar17->volume_envelope).enabled = (_Bool)(bVar9 & 1);
      (pxVar17->volume_envelope).sustain_enabled = (_Bool)(bVar9 >> 1 & 1);
      (pxVar17->volume_envelope).loop_enabled = (_Bool)(bVar9 >> 2 & 1);
      if (uVar5 + 0xea < uVar30) {
        bVar9 = moddata[uVar5 + 0xea];
      }
      else {
        bVar9 = 0;
      }
      (pxVar17->panning_envelope).enabled = (_Bool)(bVar9 & 1);
      (pxVar17->panning_envelope).sustain_enabled = (_Bool)(bVar9 >> 1 & 1);
      (pxVar17->panning_envelope).loop_enabled = (_Bool)(bVar9 >> 2 & 1);
      if (uVar5 + 0xeb < uVar30) {
        bVar9 = moddata[uVar5 + 0xeb];
        pxVar17->vibrato_type = (uint)bVar9;
        if (bVar9 == XM_RAMP_DOWN_WAVEFORM) {
          pxVar17->vibrato_type = XM_SQUARE_WAVEFORM;
        }
        else if (bVar9 == 2) {
          pxVar17->vibrato_type = XM_RAMP_DOWN_WAVEFORM;
        }
      }
      else {
        pxVar17->vibrato_type = XM_SINE_WAVEFORM;
      }
      if (uVar5 + 0xec < uVar30) {
        uVar15 = moddata[uVar5 + 0xec];
      }
      else {
        uVar15 = '\0';
      }
      pxVar17->vibrato_sweep = uVar15;
      if (uVar5 + 0xed < uVar30) {
        uVar15 = moddata[uVar5 + 0xed];
      }
      else {
        uVar15 = '\0';
      }
      pxVar17->vibrato_depth = uVar15;
      if (uVar5 + 0xee < uVar30) {
        uVar15 = moddata[uVar5 + 0xee];
      }
      else {
        uVar15 = '\0';
      }
      pxVar17->vibrato_rate = uVar15;
      if (uVar5 + 0xef < uVar30) {
        uVar10 = (ushort)(byte)moddata[uVar5 + 0xef];
      }
      else {
        uVar10 = 0;
      }
      if (uVar5 + 0xf0 < uVar30) {
        uVar19 = (ushort)(byte)moddata[uVar5 + 0xf0] << 8;
      }
      else {
        uVar19 = 0;
      }
      pxVar17->volume_fadeout = uVar10 | uVar19;
      pxVar17->samples = (xm_sample_t *)local_70;
      uVar24 = (ulong)pxVar17->num_samples;
      local_70 = (xm_instrument_t *)(local_70->sample_of_notes + uVar24 * 0x38 + -2);
    }
    lVar32 = 0;
    for (uVar5 = 0; uVar5 < uVar24; uVar5 = uVar5 + 1) {
      uVar13 = 0;
      uVar7 = 0;
      if (uVar30 < moddata_length) {
        uVar7 = (uint)(byte)moddata[uVar30];
      }
      if (uVar30 + 1 < moddata_length) {
        uVar13 = (uint)(byte)moddata[uVar30 + 1] << 8;
      }
      uVar28 = 0;
      uVar12 = 0;
      if (uVar30 + 2 < moddata_length) {
        uVar12 = (uint)(byte)moddata[uVar30 + 2];
      }
      if (uVar30 + 3 < moddata_length) {
        uVar28 = (uint)(byte)moddata[uVar30 + 3] << 8;
      }
      pxVar2 = pxVar17->samples;
      uVar13 = (uVar28 | uVar12) << 0x10 | uVar13 | uVar7;
      *(uint *)((long)&pxVar2->length + lVar32) = uVar13;
      uVar7 = 0;
      uVar28 = 0;
      if (uVar30 + 4 < moddata_length) {
        uVar28 = (uint)(byte)moddata[uVar30 + 4];
      }
      if (uVar30 + 5 < moddata_length) {
        uVar7 = (uint)(byte)moddata[uVar30 + 5] << 8;
      }
      uVar12 = 0;
      uVar23 = 0;
      if (uVar30 + 6 < moddata_length) {
        uVar23 = (uint)(byte)moddata[uVar30 + 6];
      }
      if (uVar30 + 7 < moddata_length) {
        uVar12 = (uint)(byte)moddata[uVar30 + 7] << 8;
      }
      uVar7 = (uVar12 | uVar23) << 0x10 | uVar7 | uVar28;
      *(uint *)((long)&pxVar2->loop_start + lVar32) = uVar7;
      uVar28 = 0;
      uVar12 = 0;
      if (uVar30 + 8 < moddata_length) {
        uVar12 = (uint)(byte)moddata[uVar30 + 8];
      }
      if (uVar30 + 9 < moddata_length) {
        uVar28 = (uint)(byte)moddata[uVar30 + 9] << 8;
      }
      uVar23 = 0;
      uVar29 = 0;
      if (uVar30 + 10 < moddata_length) {
        uVar29 = (uint)(byte)moddata[uVar30 + 10];
      }
      if (uVar30 + 0xb < moddata_length) {
        uVar23 = (uint)(byte)moddata[uVar30 + 0xb] << 8;
      }
      uVar28 = (uVar23 | uVar29) << 0x10 | uVar28 | uVar12;
      *(uint *)((long)&pxVar2->loop_length + lVar32) = uVar28;
      uVar28 = uVar28 + uVar7;
      *(uint *)((long)&pxVar2->loop_end + lVar32) = uVar28;
      fVar33 = 0.0;
      if (uVar30 + 0xc < moddata_length) {
        fVar33 = (float)(byte)moddata[uVar30 + 0xc] * 0.015625;
      }
      *(float *)((long)&pxVar2->volume + lVar32) = fVar33;
      if (uVar30 + 0xd < moddata_length) {
        cVar26 = moddata[uVar30 + 0xd];
      }
      else {
        cVar26 = '\0';
      }
      (&pxVar2->finetune)[lVar32] = cVar26;
      if (uVar13 < uVar7) {
        *(uint *)((long)&pxVar2->loop_start + lVar32) = uVar13;
        uVar7 = uVar13;
      }
      if (uVar13 < uVar28) {
        *(uint *)((long)&pxVar2->loop_end + lVar32) = uVar13;
        uVar28 = uVar13;
      }
      *(uint *)((long)&pxVar2->loop_length + lVar32) = uVar28 - uVar7;
      uVar12 = 0;
      if (uVar30 + 0xe < moddata_length) {
        uVar12 = (uint)(byte)moddata[uVar30 + 0xe];
        if (((moddata[uVar30 + 0xe] & 3U) == 0) || (uVar28 == uVar7)) goto LAB_00104026;
        if ((uVar12 & 3) == 1) {
          *(undefined4 *)((long)&pxVar2->loop_type + lVar32) = 1;
        }
        else {
          *(undefined4 *)((long)&pxVar2->loop_type + lVar32) = 2;
        }
      }
      else {
LAB_00104026:
        *(undefined4 *)((long)&pxVar2->loop_type + lVar32) = 0;
      }
      (&pxVar2->bits)[lVar32] = (char)((uVar12 & 0x10) >> 4) * '\b' + '\b';
      fVar33 = 0.0;
      if (uVar30 + 0xf < moddata_length) {
        fVar33 = (float)(byte)moddata[uVar30 + 0xf];
      }
      *(float *)((long)&pxVar2->panning + lVar32) = fVar33 / 255.0;
      if (uVar30 + 0x10 < moddata_length) {
        cVar26 = moddata[uVar30 + 0x10];
      }
      else {
        cVar26 = '\0';
      }
      (&pxVar2->relative_note)[lVar32] = cVar26;
      *(xm_instrument_t **)((long)&pxVar2->field_11 + lVar32) = local_70;
      if ((uVar12 & 0x10) != 0) {
        *(uint *)((long)&pxVar2->loop_start + lVar32) = uVar7 >> 1;
        *(uint *)((long)&pxVar2->loop_length + lVar32) = uVar28 - uVar7 >> 1;
        *(uint *)((long)&pxVar2->loop_end + lVar32) = uVar28 >> 1;
        *(uint *)((long)&pxVar2->length + lVar32) = uVar13 >> 1;
      }
      local_70 = (xm_instrument_t *)(local_70->sample_of_notes + ((ulong)uVar13 - 2));
      uVar30 = uVar30 + 0x28;
      uVar24 = (ulong)pxVar17->num_samples;
      lVar32 = lVar32 + 0x38;
    }
    uVar5 = uVar30;
    for (uVar6 = 0; uVar6 < uVar24; uVar6 = uVar6 + 1) {
      pxVar2 = pxVar17->samples;
      uVar13 = pxVar2[uVar6].length;
      if (pxVar2[uVar6].bits == '\x10') {
        sVar22 = 0;
        for (uVar30 = 0; (ulong)uVar13 * 2 != uVar30; uVar30 = uVar30 + 2) {
          uVar24 = (uVar30 & 0xffffffff) + uVar5;
          uVar10 = 0;
          uVar19 = 0;
          if (uVar24 < moddata_length) {
            uVar19 = (ushort)(byte)moddata[uVar24];
          }
          if (uVar24 + 1 < moddata_length) {
            uVar10 = (ushort)(byte)moddata[uVar24 + 1] << 8;
          }
          sVar22 = sVar22 + (uVar10 | uVar19);
          *(short *)(pxVar2[uVar6].field_11.data8 + uVar30) = sVar22;
        }
        uVar13 = uVar13 * 2;
      }
      else {
        cVar26 = '\0';
        for (uVar30 = 0; uVar13 != uVar30; uVar30 = uVar30 + 1) {
          cVar27 = '\0';
          if (uVar5 + uVar30 < moddata_length) {
            cVar27 = moddata[uVar30 + uVar5];
          }
          cVar26 = cVar26 + cVar27;
          pxVar2[uVar6].field_11.data8[uVar30] = cVar26;
        }
        uVar13 = pxVar2[uVar6].length;
      }
      uVar5 = uVar5 + uVar13;
      uVar24 = (ulong)pxVar17->num_samples;
    }
    uVar31 = uVar31 + 1;
    local_60 = local_60 + 0xf8;
    local_48 = local_48 + 0xf8;
  } while( true );
}

Assistant:

char* xm_load_module(xm_context_t* ctx, const char* moddata, size_t moddata_length, char* mempool) {
	size_t offset = 0;
	xm_module_t* mod = &(ctx->module);

	/* Read XM header */
#if XM_STRINGS
	READ_MEMCPY(mod->name, offset + 17, MODULE_NAME_LENGTH);
	READ_MEMCPY(mod->trackername, offset + 38, TRACKER_NAME_LENGTH);
#endif
	offset += 60;

	/* Read module header */
	uint32_t header_size = READ_U32(offset);

	mod->length = READ_U16(offset + 4);
	mod->restart_position = READ_U16(offset + 6);
	mod->num_channels = READ_U16(offset + 8);
	mod->num_patterns = READ_U16(offset + 10);
	mod->num_instruments = READ_U16(offset + 12);

	mod->patterns = (xm_pattern_t*)mempool;
	mempool += mod->num_patterns * sizeof(xm_pattern_t);

	mod->instruments = (xm_instrument_t*)mempool;
	mempool += mod->num_instruments * sizeof(xm_instrument_t);

	uint16_t flags = READ_U32(offset + 14);
	mod->frequency_type = (flags & (1 << 0)) ? XM_LINEAR_FREQUENCIES : XM_AMIGA_FREQUENCIES;

	ctx->tempo = READ_U16(offset + 16);
	ctx->bpm = READ_U16(offset + 18);

	READ_MEMCPY(mod->pattern_table, offset + 20, PATTERN_ORDER_TABLE_LENGTH);
	offset += header_size;

	/* Read patterns */
	for(uint16_t i = 0; i < mod->num_patterns; ++i) {
		uint16_t packed_patterndata_size = READ_U16(offset + 7);
		xm_pattern_t* pat = mod->patterns + i;

		pat->num_rows = READ_U16(offset + 5);

		pat->slots = (xm_pattern_slot_t*)mempool;
		mempool += mod->num_channels * pat->num_rows * sizeof(xm_pattern_slot_t);

		/* Pattern header length */
		offset += READ_U32(offset);

		if(packed_patterndata_size == 0) {
			/* No pattern data is present */
			memset(pat->slots, 0, sizeof(xm_pattern_slot_t) * pat->num_rows * mod->num_channels);
		} else {
			/* This isn't your typical for loop */
			for(uint16_t j = 0, k = 0; j < packed_patterndata_size; ++k) {
				uint8_t note = READ_U8(offset + j);
				xm_pattern_slot_t* slot = pat->slots + k;

				if(note & (1 << 7)) {
					/* MSB is set, this is a compressed packet */
					++j;

					if(note & (1 << 0)) {
						/* Note follows */
						slot->note = READ_U8(offset + j);
						++j;
					} else {
						slot->note = 0;
					}

					if(note & (1 << 1)) {
						/* Instrument follows */
						slot->instrument = READ_U8(offset + j);
						++j;
					} else {
						slot->instrument = 0;
					}

					if(note & (1 << 2)) {
						/* Volume column follows */
						slot->volume_column = READ_U8(offset + j);
						++j;
					} else {
						slot->volume_column = 0;
					}

					if(note & (1 << 3)) {
						/* Effect follows */
						slot->effect_type = READ_U8(offset + j);
						++j;
					} else {
						slot->effect_type = 0;
					}

					if(note & (1 << 4)) {
						/* Effect parameter follows */
						slot->effect_param = READ_U8(offset + j);
						++j;
					} else {
						slot->effect_param = 0;
					}
				} else {
					/* Uncompressed packet */
					slot->note = note;
					slot->instrument = READ_U8(offset + j + 1);
					slot->volume_column = READ_U8(offset + j + 2);
					slot->effect_type = READ_U8(offset + j + 3);
					slot->effect_param = READ_U8(offset + j + 4);
					j += 5;
				}
			}
		}

		offset += packed_patterndata_size;
	}

	/* Read instruments */
	for(uint16_t i = 0; i < ctx->module.num_instruments; ++i) {
		xm_instrument_t* instr = mod->instruments + i;

		/* Original FT2 would load instruments with a direct read into the
		   instrument data structure that was previously zeroed. This means
		   that if the declared length was less than INSTRUMENT_HEADER_LENGTH,
		   all excess data would be zeroed. This is used by the XM compressor
		   BoobieSqueezer. To implement this, bound all reads to the header size. */
		uint32_t ins_header_size = READ_U32(offset);
		if (ins_header_size == 0 || ins_header_size > INSTRUMENT_HEADER_LENGTH)
			ins_header_size = INSTRUMENT_HEADER_LENGTH;

#if XM_STRINGS
		READ_MEMCPY_BOUND(instr->name, offset + 4, INSTRUMENT_NAME_LENGTH, offset + ins_header_size);
		instr->name[INSTRUMENT_NAME_LENGTH] = 0;
#endif
	    instr->num_samples = READ_U16_BOUND(offset + 27, offset + ins_header_size);

		if(instr->num_samples > 0) {
			/* Read extra header properties */
			READ_MEMCPY_BOUND(instr->sample_of_notes, offset + 33, NUM_NOTES, offset + ins_header_size);

			instr->volume_envelope.num_points = READ_U8_BOUND(offset + 225, offset + ins_header_size);
			if (instr->volume_envelope.num_points > NUM_ENVELOPE_POINTS)
				instr->volume_envelope.num_points = NUM_ENVELOPE_POINTS;

			instr->panning_envelope.num_points = READ_U8_BOUND(offset + 226, offset + ins_header_size);
			if (instr->panning_envelope.num_points > NUM_ENVELOPE_POINTS)
				instr->panning_envelope.num_points = NUM_ENVELOPE_POINTS;

			for(uint8_t j = 0; j < instr->volume_envelope.num_points; ++j) {
				instr->volume_envelope.points[j].frame = READ_U16_BOUND(offset + 129 + 4 * j, offset + ins_header_size);
				instr->volume_envelope.points[j].value = READ_U16_BOUND(offset + 129 + 4 * j + 2, offset + ins_header_size);
			}

			for(uint8_t j = 0; j < instr->panning_envelope.num_points; ++j) {
				instr->panning_envelope.points[j].frame = READ_U16_BOUND(offset + 177 + 4 * j, offset + ins_header_size);
				instr->panning_envelope.points[j].value = READ_U16_BOUND(offset + 177 + 4 * j + 2, offset + ins_header_size);
			}

			instr->volume_envelope.sustain_point = READ_U8_BOUND(offset + 227, offset + ins_header_size);
			instr->volume_envelope.loop_start_point = READ_U8_BOUND(offset + 228, offset + ins_header_size);
			instr->volume_envelope.loop_end_point = READ_U8_BOUND(offset + 229, offset + ins_header_size);

			instr->panning_envelope.sustain_point = READ_U8_BOUND(offset + 230, offset + ins_header_size);
			instr->panning_envelope.loop_start_point = READ_U8_BOUND(offset + 231, offset + ins_header_size);
			instr->panning_envelope.loop_end_point = READ_U8_BOUND(offset + 232, offset + ins_header_size);

			// Fix broken modules with loop points outside of defined points
			if (instr->volume_envelope.num_points > 0) {
				instr->volume_envelope.loop_start_point =
					MIN(instr->volume_envelope.loop_start_point, instr->volume_envelope.num_points-1);
				instr->volume_envelope.loop_end_point =
					MIN(instr->volume_envelope.loop_end_point,   instr->volume_envelope.num_points-1);
			}
			if (instr->panning_envelope.num_points > 0) {
				instr->panning_envelope.loop_start_point =
					MIN(instr->panning_envelope.loop_start_point, instr->panning_envelope.num_points-1);
				instr->panning_envelope.loop_end_point =
					MIN(instr->panning_envelope.loop_end_point,   instr->panning_envelope.num_points-1);
			}

			uint8_t flags = READ_U8_BOUND(offset + 233, offset + ins_header_size);
			instr->volume_envelope.enabled = flags & (1 << 0);
			instr->volume_envelope.sustain_enabled = flags & (1 << 1);
			instr->volume_envelope.loop_enabled = flags & (1 << 2);

			flags = READ_U8_BOUND(offset + 234, offset + ins_header_size);
			instr->panning_envelope.enabled = flags & (1 << 0);
			instr->panning_envelope.sustain_enabled = flags & (1 << 1);
			instr->panning_envelope.loop_enabled = flags & (1 << 2);

			instr->vibrato_type = READ_U8_BOUND(offset + 235, offset + ins_header_size);
			if(instr->vibrato_type == 2) {
				instr->vibrato_type = 1;
			} else if(instr->vibrato_type == 1) {
				instr->vibrato_type = 2;
			}
			instr->vibrato_sweep = READ_U8_BOUND(offset + 236, offset + ins_header_size);
			instr->vibrato_depth = READ_U8_BOUND(offset + 237, offset + ins_header_size);
			instr->vibrato_rate = READ_U8_BOUND(offset + 238, offset + ins_header_size);
			instr->volume_fadeout = READ_U16_BOUND(offset + 239, offset + ins_header_size);

			instr->samples = (xm_sample_t*)mempool;
			mempool += instr->num_samples * sizeof(xm_sample_t);
		} else {
			instr->samples = NULL;
		}

		/* Instrument header size */
		offset += ins_header_size;

		for(uint16_t j = 0; j < instr->num_samples; ++j) {
			/* Read sample header */
			xm_sample_t* sample = instr->samples + j;

			sample->length = READ_U32(offset);
			sample->loop_start = READ_U32(offset + 4);
			sample->loop_length = READ_U32(offset + 8);
			sample->loop_end = sample->loop_start + sample->loop_length;
			sample->volume = (float)READ_U8(offset + 12) / (float)0x40;
			sample->finetune = (int8_t)READ_U8(offset + 13);

			/* Fix invalid loop definitions */
			if (sample->loop_start > sample->length)
				sample->loop_start = sample->length;
			if (sample->loop_end > sample->length)
				sample->loop_end = sample->length;
			sample->loop_length = sample->loop_end - sample->loop_start;

			uint8_t flags = READ_U8(offset + 14);
			if((flags & 3) == 0 || sample->loop_length == 0) {
				sample->loop_type = XM_NO_LOOP;
			} else if((flags & 3) == 1) {
				sample->loop_type = XM_FORWARD_LOOP;
			} else {
				sample->loop_type = XM_PING_PONG_LOOP;
			}

			sample->bits = (flags & (1 << 4)) ? 16 : 8;

			sample->panning = (float)READ_U8(offset + 15) / (float)0xFF;
			sample->relative_note = (int8_t)READ_U8(offset + 16);
#if XM_STRINGS
			READ_MEMCPY(sample->name, offset + 18, SAMPLE_NAME_LENGTH);
			sample->name[SAMPLE_NAME_LENGTH] = 0;
#endif
			sample->data8 = (int8_t*)mempool;
			mempool += sample->length;

			if(sample->bits == 16) {
				sample->loop_start >>= 1;
				sample->loop_length >>= 1;
				sample->loop_end >>= 1;
				sample->length >>= 1;
			}

			/* Notice that, even if there's a "sample header size" in the
			   instrument header, that value seems ignored, and might even
			   be wrong in some corrupted modules. */
			offset += 40;
		}

		for(uint16_t j = 0; j < instr->num_samples; ++j) {
			/* Read sample data */
			xm_sample_t* sample = instr->samples + j;
			uint32_t length = sample->length;

			if(sample->bits == 16) {
				int16_t v = 0;
				for(uint32_t k = 0; k < length; ++k) {
					v = v + (int16_t)READ_U16(offset + (k << 1));
					sample->data16[k] = v;
				}
				offset += sample->length << 1;
			} else {
				int8_t v = 0;
				for(uint32_t k = 0; k < length; ++k) {
					v = v + (int8_t)READ_U8(offset + k);
					sample->data8[k] = v;
				}
				offset += sample->length;
			}
		}
	}

	return mempool;
}